

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AudioDataGeneration.cpp
# Opt level: O3

Value * soul::generateWaveform
                  (Value *__return_storage_ptr__,double frequency,double sampleRate,
                  int64_t numFrames,Generator *generator,uint32_t oversamplingFactor)

{
  double dVar1;
  undefined1 auVar2 [12];
  ChannelArrayView<const_float> source;
  ChannelArrayView<const_float> source_00;
  float **ppfVar3;
  uint uVar4;
  Size SVar5;
  uint uVar6;
  float *pfVar7;
  uint uVar8;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  SeparateChannelLayout<float> SVar9;
  ChannelArrayBuffer<float> resampledData;
  ChannelArrayBuffer<float> data;
  AllocatedBuffer<float,_choc::buffer::SeparateChannelLayout> local_98;
  AllocatedBuffer<float,_choc::buffer::SeparateChannelLayout> local_80;
  int64_t local_68;
  float **local_60;
  uint32_t uStack_58;
  undefined4 uStack_54;
  Size local_50;
  float **local_48;
  uint uStack_40;
  undefined4 uStack_3c;
  Size local_38;
  
  if ((((0x14996fff < numFrames) || (sampleRate <= 0.0)) || (frequency <= 0.0)) || (numFrames < 1))
  {
    (__return_storage_ptr__->packedData).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->packedData).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->packedData).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->dictionary).super_StringDictionary._vptr_StringDictionary =
         (_func_int **)&PTR__SimpleStringDictionary_002f5a68;
    (__return_storage_ptr__->value).type.content.object = (Object *)0x0;
    (__return_storage_ptr__->value).type.allocator = (Allocator *)0x0;
    (__return_storage_ptr__->value).data = (uint8_t *)0x0;
    (__return_storage_ptr__->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->dictionary).strings.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_finish + 1) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->dictionary).strings.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage + 1) = 0;
    (__return_storage_ptr__->value).stringDictionary =
         &(__return_storage_ptr__->dictionary).super_StringDictionary;
  }
  else {
    uVar6 = (int)numFrames * oversamplingFactor;
    SVar5 = (Size)(((ulong)uVar6 << 0x20) + 1);
    local_68 = numFrames;
    if (uVar6 == 0) {
      local_80.view.data._12_4_ = 0;
      auVar2 = SUB1612(ZEXT816(0),0);
    }
    else {
      SVar9 = choc::buffer::SeparateChannelLayout<float>::createAllocated(SVar5);
      auVar2 = SVar9._0_12_;
    }
    ppfVar3 = auVar2._0_8_;
    uVar4 = auVar2._8_4_;
    local_80.view.data.offset = uVar4;
    pfVar7 = *ppfVar3;
    generator->phaseIncrement = frequency / ((double)oversamplingFactor * sampleRate);
    local_80.view.data.channels = ppfVar3;
    local_80.view.size = SVar5;
    if (uVar6 != 0) {
      pfVar7 = pfVar7 + uVar4;
      uVar8 = 0;
      do {
        (*generator->_vptr_Generator[2])(generator);
        *pfVar7 = (float)(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
        for (dVar1 = generator->phaseIncrement + generator->currentPhase; 1.0 <= dVar1;
            dVar1 = dVar1 + -1.0) {
        }
        pfVar7 = pfVar7 + 1;
        generator->currentPhase = dVar1;
        uVar8 = uVar8 + 1;
      } while (uVar8 < uVar6);
    }
    if (oversamplingFactor == 1) {
      source.data._12_4_ = uStack_3c;
      source.data.offset = uVar4;
      source.data.channels = ppfVar3;
      source.size = SVar5;
      local_48 = ppfVar3;
      uStack_40 = uVar4;
      local_38 = SVar5;
      convertAudioDataToObject(__return_storage_ptr__,source,sampleRate);
    }
    else {
      SVar5 = (Size)((local_68 << 0x20) + 1);
      if ((int)local_68 == 0) {
        local_98.view.data._12_4_ = 0;
        auVar2 = SUB1612(ZEXT816(0),0);
      }
      else {
        SVar9 = choc::buffer::SeparateChannelLayout<float>::createAllocated(SVar5);
        auVar2 = SVar9._0_12_;
      }
      local_98.view.data.channels = auVar2._0_8_;
      local_98.view.data.offset = auVar2._8_4_;
      local_98.view.size = SVar5;
      resampleToFit<choc::buffer::AllocatedBuffer<float,choc::buffer::SeparateChannelLayout>&,choc::buffer::AllocatedBuffer<float,choc::buffer::SeparateChannelLayout>>
                (&local_98,&local_80,0x32);
      local_60 = local_98.view.data.channels;
      uStack_58 = local_98.view.data.offset;
      local_50 = local_98.view.size;
      source_00.data._12_4_ = uStack_54;
      source_00.data.offset = local_98.view.data.offset;
      source_00.data.channels = local_98.view.data.channels;
      source_00.size = local_98.view.size;
      convertAudioDataToObject(__return_storage_ptr__,source_00,sampleRate);
      ppfVar3 = local_80.view.data.channels;
      if ((local_98.view.data.channels != (float **)0x0) &&
         (*local_98.view.data.channels != (float *)0x0)) {
        operator_delete__(*local_98.view.data.channels);
        ppfVar3 = local_80.view.data.channels;
      }
    }
    if ((ppfVar3 != (float **)0x0) && (*ppfVar3 != (float *)0x0)) {
      operator_delete__(*ppfVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

choc::value::Value generateWaveform (double frequency, double sampleRate, int64_t numFrames,
                                     WaveGenerators::Generator& generator,
                                     uint32_t oversamplingFactor)
{
    if (numFrames > 0 && frequency > 0 && sampleRate > 0 && numFrames < 48000 * 60 * 60 * 2)
    {
        choc::buffer::ChannelArrayBuffer<float> data (1, (uint32_t) (numFrames * oversamplingFactor));
        auto dst = data.getIterator (0);

        generator.init (frequency, sampleRate * oversamplingFactor);

        for (uint32_t i = 0; i < data.getNumFrames(); ++i)
        {
            *dst = (float) generator.getSample();
            ++dst;
            generator.advance();
        }

        if (oversamplingFactor == 1)
            return convertAudioDataToObject (data, sampleRate);

        // Resample to the right size
        choc::buffer::ChannelArrayBuffer<float> resampledData (1, (uint32_t) numFrames);
        resampleToFit (resampledData, data);
        return convertAudioDataToObject (resampledData, sampleRate);
    }

    return {};
}